

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_cmd_array.cpp
# Opt level: O0

void __thiscall
NshCmdArrayRegister_FailureTooManyElements_Test::NshCmdArrayRegister_FailureTooManyElements_Test
          (NshCmdArrayRegister_FailureTooManyElements_Test *this)

{
  NshCmdArrayRegister_FailureTooManyElements_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__NshCmdArrayRegister_FailureTooManyElements_Test_001c81c8;
  return;
}

Assistant:

TEST(NshCmdArrayRegister, FailureTooManyElements)
{
    nsh_cmd_array_t cmds;
    ASSERT_EQ(nsh_cmd_array_init(&cmds), NSH_STATUS_OK);

    for (auto i = 0u; i < NSH_CMD_MAX_COUNT; i++) {
        ASSERT_EQ(nsh_cmd_array_register(&cmds, cmd_test_name, &cmd_test_handler), NSH_STATUS_OK);
    }

    auto status = nsh_cmd_array_register(&cmds, cmd_test_name, &cmd_test_handler);

    ASSERT_EQ(status, NSH_STATUS_MAX_CMD_NB_REACH);
}